

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

hash_t __thiscall
TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>::CountUsed
          (TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_> *this)

{
  bool bVar1;
  Node *local_20;
  Node *n;
  hash_t ct;
  hash_t used;
  TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_> *this_local;
  
  n._4_4_ = 0;
  local_20 = this->Nodes;
  n._0_4_ = this->Size;
  while ((hash_t)n != 0) {
    bVar1 = Node::IsNil(local_20);
    if (!bVar1) {
      n._4_4_ = n._4_4_ + 1;
    }
    local_20 = local_20 + 1;
    n._0_4_ = (hash_t)n - 1;
  }
  if (n._4_4_ == this->NumUsed) {
    return this->NumUsed;
  }
  __assert_fail("used == NumUsed",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                ,0x2ba,
                "hash_t TMap<FName, FString>::CountUsed() const [KT = FName, VT = FString, HashTraits = THashTraits<FName>, ValueTraits = TValueTraits<FString>]"
               );
}

Assistant:

hash_t CountUsed() const
	{
#ifdef _DEBUG
		hash_t used = 0;
		hash_t ct = Size;
		for (Node *n = Nodes; ct-- > 0; ++n)
		{
			if (!n->IsNil())
			{
				++used;
			}
		}
		assert (used == NumUsed);
#endif
		return NumUsed;
	}